

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRandom.cpp
# Opt level: O0

void anon_unknown.dwarf_85aa3::testGenerator<Imath_2_5::Rand32>(void)

{
  int iVar1;
  ostream *poVar2;
  float fVar3;
  double dVar4;
  double r2;
  double r1;
  double r0;
  int i_6;
  double pow_2_60;
  double r_1;
  int i_5;
  double rMax;
  double rMin;
  int i_4;
  int i_3;
  float diff;
  float r;
  int i_2;
  float previous;
  Rand32 rand;
  int i_1;
  int i;
  int *d;
  int *v;
  int diffs [23];
  int values [11];
  int M;
  int N;
  float in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedc;
  undefined1 in_stack_fffffffffffffedd;
  undefined1 in_stack_fffffffffffffede;
  undefined1 in_stack_fffffffffffffedf;
  undefined1 uVar5;
  Rand32 *in_stack_fffffffffffffee0;
  int local_fc;
  int local_e4;
  double local_e0;
  double local_d8;
  int local_d0;
  int local_cc;
  int local_c0;
  float local_bc;
  int local_b0;
  int local_ac;
  Rand32 aRStack_68 [6];
  int local_38 [10];
  int local_10;
  undefined4 local_8;
  undefined4 local_4;
  
  local_4 = 10;
  local_8 = 100000;
  for (local_ac = 0; local_ac < 0xb; local_ac = local_ac + 1) {
    local_38[local_ac] = 0;
  }
  for (local_b0 = -10; local_b0 < 0xb; local_b0 = local_b0 + 1) {
    *(undefined4 *)((long)&aRStack_68[0]._state + (long)local_b0 * 4) = 0;
  }
  Imath_2_5::Rand32::Rand32
            (in_stack_fffffffffffffee0,
             CONCAT17(in_stack_fffffffffffffedf,
                      CONCAT16(in_stack_fffffffffffffede,
                               CONCAT15(in_stack_fffffffffffffedd,
                                        CONCAT14(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8
                                                )))));
  local_bc = 0.0;
  for (local_c0 = 0; local_c0 < 1000000; local_c0 = local_c0 + 1) {
    fVar3 = Imath_2_5::Rand32::nextf
                      (in_stack_fffffffffffffee0,
                       (float)CONCAT13(in_stack_fffffffffffffedf,
                                       CONCAT12(in_stack_fffffffffffffede,
                                                CONCAT11(in_stack_fffffffffffffedd,
                                                         in_stack_fffffffffffffedc))),
                       in_stack_fffffffffffffed8);
    local_38[(int)(fVar3 * 10.0)] = local_38[(int)(fVar3 * 10.0)] + 1;
    in_stack_fffffffffffffee0 = aRStack_68;
    iVar1 = Imath_2_5::floor<double>((double)((fVar3 - local_bc) * 10.0) + 0.5);
    *(int *)((long)&in_stack_fffffffffffffee0->_state + (long)iVar1 * 4) =
         *(int *)((long)&in_stack_fffffffffffffee0->_state + (long)iVar1 * 4) + 1;
    local_bc = fVar3;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"  values");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  for (local_cc = 0; local_cc < 10; local_cc = local_cc + 1) {
    iVar1 = local_38[local_cc] + -100000;
    if (iVar1 < 1) {
      iVar1 = -iVar1;
    }
    if (1000.0 <= (double)iVar1) {
      __assert_fail("abs (v[i] - M) < 0.01 * M",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testRandom.cpp"
                    ,0x85,"void (anonymous namespace)::testGenerator() [Rand = Imath_2_5::Rand32]");
    }
  }
  if (local_10 != 0) {
    __assert_fail("v[N] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testRandom.cpp"
                  ,0x8d,"void (anonymous namespace)::testGenerator() [Rand = Imath_2_5::Rand32]");
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"  differences between successive values");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  for (local_d0 = -10; local_d0 < 0xb; local_d0 = local_d0 + 1) {
    iVar1 = local_d0;
    if (local_d0 < 1) {
      iVar1 = -local_d0;
    }
    iVar1 = ((10 - iVar1) * 100000) / 10 -
            *(int *)((long)&aRStack_68[0]._state + (long)local_d0 * 4);
    if (iVar1 < 1) {
      iVar1 = -iVar1;
    }
    if (5000.0 <= (double)iVar1) {
      __assert_fail("abs ((N - abs (i)) * M / N - d[i]) < 0.05 * M",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testRandom.cpp"
                    ,0x94,"void (anonymous namespace)::testGenerator() [Rand = Imath_2_5::Rand32]");
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"  range");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_d8 = 1.0;
  local_e0 = 0.0;
  for (local_e4 = 0; local_e4 < 0x989681; local_e4 = local_e4 + 1) {
    fVar3 = Imath_2_5::Rand32::nextf
                      (in_stack_fffffffffffffee0,
                       (float)CONCAT13(in_stack_fffffffffffffedf,
                                       CONCAT12(in_stack_fffffffffffffede,
                                                CONCAT11(in_stack_fffffffffffffedd,
                                                         in_stack_fffffffffffffedc))),
                       in_stack_fffffffffffffed8);
    dVar4 = (double)fVar3;
    if (dVar4 < local_d8) {
      local_d8 = dVar4;
    }
    if (local_e0 < dVar4) {
      local_e0 = dVar4;
    }
  }
  uVar5 = local_d8 < 0.0001 && 0.9999 < local_e0;
  if (local_d8 >= 0.0001 || 0.9999 >= local_e0) {
    __assert_fail("rMin < 0.0001 && rMax > 0.9999",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testRandom.cpp"
                  ,0xac,"void (anonymous namespace)::testGenerator() [Rand = Imath_2_5::Rand32]");
  }
  local_fc = 0;
  while( true ) {
    if (10000000 < local_fc) {
      return;
    }
    fVar3 = Imath_2_5::Rand32::nextf
                      (in_stack_fffffffffffffee0,
                       (float)CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffede,
                                                      CONCAT11(in_stack_fffffffffffffedd,
                                                               in_stack_fffffffffffffedc))),
                       in_stack_fffffffffffffed8);
    in_stack_fffffffffffffede = -2.0 <= fVar3 && fVar3 <= 3.0;
    if (-2.0 > fVar3 || fVar3 > 3.0) {
      __assert_fail("r0 >= -2.0 && r0 <= 3.0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testRandom.cpp"
                    ,0xb3,"void (anonymous namespace)::testGenerator() [Rand = Imath_2_5::Rand32]");
    }
    fVar3 = Imath_2_5::Rand32::nextf
                      (in_stack_fffffffffffffee0,
                       (float)CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffede,
                                                      CONCAT11(in_stack_fffffffffffffedd,
                                                               in_stack_fffffffffffffedc))),
                       in_stack_fffffffffffffed8);
    in_stack_fffffffffffffedd = -1.1529215e+18 <= fVar3 && fVar3 <= 1.0;
    if (-1.1529215e+18 > fVar3 || fVar3 > 1.0) {
      __assert_fail("r1 >= -pow_2_60 && r1 <= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testRandom.cpp"
                    ,0xb6,"void (anonymous namespace)::testGenerator() [Rand = Imath_2_5::Rand32]");
    }
    fVar3 = Imath_2_5::Rand32::nextf
                      (in_stack_fffffffffffffee0,
                       (float)CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffede,
                                                      CONCAT11(in_stack_fffffffffffffedd,
                                                               in_stack_fffffffffffffedc))),
                       in_stack_fffffffffffffed8);
    in_stack_fffffffffffffedc = -1.0 <= fVar3 && fVar3 <= 1.1529215e+18;
    if (-1.0 > fVar3 || fVar3 > 1.1529215e+18) break;
    local_fc = local_fc + 1;
  }
  __assert_fail("r2 >= -1 && r2 <= pow_2_60",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testRandom.cpp"
                ,0xb9,"void (anonymous namespace)::testGenerator() [Rand = Imath_2_5::Rand32]");
}

Assistant:

void
testGenerator ()
{
    //
    // Test if the values, and the differences between
    // successive values, are evenly distributed.
    //

    const int N = 10;
    const int M = 100000;

    int values[N + 1];
    int diffs[2 * N + 3];
    int *v = &values[0];
    int *d = &diffs[N + 2];

    for (int i = 0; i <= N; ++i)
	v[i] = 0;

    for (int i = -N; i <= N; ++i)
	d[i] = 0;

    Rand rand (0);
    float previous = 0;

    for (int i = 0; i < M * N; ++i)
    {
	float r = rand.nextf (0.0, 1.0);
	float diff = r - previous;
	previous = r;

	v[int (r * N)] += 1;
	d[IMATH_INTERNAL_NAMESPACE::floor (diff * N + 0.5)] += 1;
    }

    cout << "  values" << endl;

    for (int i = 0; i < N; ++i)
    {
	// cout << setw (4) << i << ' ' << setw(6) << v[i] << ' ';
	assert (abs (v[i] - M) < 0.01 * M);

	// for (int j = 0; j < v[i] * 60 / M; ++j)
	//      cout << '*';

	// cout << endl;
    }

    assert (v[N] == 0);

    cout << "  differences between successive values" << endl;

    for (int i = -N; i <= N; ++i)
    {
	// cout << setw (4) << i << ' ' << setw (6) << d[i] << ' ';
	assert (abs ((N - abs (i)) * M / N - d[i]) < 0.05 * M);

	// for (int j = 0; j < d[i] * 60 / M; ++j)
	//     cout << '*';

	// cout << endl;
    }

    cout << "  range" << endl;

    double rMin = 1.0;
    double rMax = 0.0;

    for (int i = 0; i <= 10000000; ++i)
    {
	double r = rand.nextf (0.0, 1.0);

	if (rMin > r)
	    rMin = r;

	if (rMax < r)
	    rMax = r;
    }

    assert (rMin < 0.0001 && rMax > 0.9999);

    const double pow_2_60 = double (1073741824) * double (1073741824);

    for (int i = 0; i <= 10000000; ++i)
    {
	double r0 = rand.nextf (-2.0, 3.0);
	assert (r0 >= -2.0 && r0 <= 3.0);

	double r1 = rand.nextf (-pow_2_60, 1);
	assert (r1 >= -pow_2_60 && r1 <= 1);

	double r2 = rand.nextf (-1, pow_2_60);
	assert (r2 >= -1 && r2 <= pow_2_60);
    }
}